

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cc
# Opt level: O3

int main(void)

{
  RandomDataProvider *pRVar1;
  long lVar2;
  RandomDataProvider *pRVar3;
  long r1;
  long r2;
  uchar buf [4];
  BogusRandomDataProvider brdp;
  SecureRandomDataProvider srdp;
  InsecureRandomDataProvider irdp;
  long local_58;
  long local_50;
  int local_44;
  RandomDataProvider local_40;
  SecureRandomDataProvider local_38;
  InsecureRandomDataProvider local_30;
  
  pRVar1 = QUtil::getRandomDataProvider();
  lVar2 = QUtil::random();
  local_58 = lVar2;
  local_50 = QUtil::random();
  if (lVar2 == local_50) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two randoms were the same\n",0x20);
  }
  InsecureRandomDataProvider::InsecureRandomDataProvider(&local_30);
  InsecureRandomDataProvider::provideRandomData(&local_30,(uchar *)&local_58,4);
  InsecureRandomDataProvider::provideRandomData(&local_30,(uchar *)&local_50,4);
  if (local_58 == local_50) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two insecure randoms were the same\n",0x29);
  }
  local_38.super_RandomDataProvider._vptr_RandomDataProvider =
       (RandomDataProvider)&PTR__RandomDataProvider_002efe30;
  SecureRandomDataProvider::provideRandomData(&local_38,(uchar *)&local_58,4);
  SecureRandomDataProvider::provideRandomData(&local_38,(uchar *)&local_50,4);
  if (local_58 == local_50) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two secure randoms were the same\n",0x27);
  }
  local_40._vptr_RandomDataProvider = (_func_int **)&PTR__RandomDataProvider_002eab30;
  QUtil::setRandomDataProvider(&local_40);
  pRVar3 = QUtil::getRandomDataProvider();
  if (pRVar3 != &local_40) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: getRandomDataProvider didn\'t return our provider\n",
               0x37);
  }
  local_58 = QUtil::random();
  local_50 = QUtil::random();
  if (local_58 != local_50) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two bogus randoms were different\n",0x27);
  }
  QUtil::initializeWithRandomBytes((uchar *)&local_44,4);
  if (local_44 != 0x3020100) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: bogus random didn\'t provide correct bytes\n",0x30);
  }
  QUtil::setRandomDataProvider((RandomDataProvider *)0x0);
  pRVar3 = QUtil::getRandomDataProvider();
  if (pRVar3 != pRVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "fail: passing null to setRandomDataProvider didn\'t reset the random data provider\n"
               ,0x52);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"random: end of tests\n",0x15);
  return 0;
}

Assistant:

int
main()
{
    RandomDataProvider* orig_rdp = QUtil::getRandomDataProvider();
    long r1 = QUtil::random();
    long r2 = QUtil::random();
    if (r1 == r2) {
        std::cout << "fail: two randoms were the same\n";
    }
    InsecureRandomDataProvider irdp;
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two insecure randoms were the same\n";
    }
#ifndef SKIP_OS_SECURE_RANDOM
    SecureRandomDataProvider srdp;
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two secure randoms were the same\n";
    }
#endif
    BogusRandomDataProvider brdp;
    QUtil::setRandomDataProvider(&brdp);
    if (QUtil::getRandomDataProvider() != &brdp) {
        std::cout << "fail: getRandomDataProvider didn't"
                     " return our provider\n";
    }
    r1 = QUtil::random();
    r2 = QUtil::random();
    if (r1 != r2) {
        std::cout << "fail: two bogus randoms were different\n";
    }
    unsigned char buf[4];
    QUtil::initializeWithRandomBytes(buf, 4);
    if (!((buf[0] == 0) && (buf[1] == 1) && (buf[2] == 2) && (buf[3] == 3))) {
        std::cout << "fail: bogus random didn't provide correct bytes\n";
    }
    QUtil::setRandomDataProvider(nullptr);
    if (QUtil::getRandomDataProvider() != orig_rdp) {
        std::cout << "fail: passing null to setRandomDataProvider "
                     "didn't reset the random data provider\n";
    }
    std::cout << "random: end of tests\n";
    return 0;
}